

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result wabt::ReadBinary(void *data,size_t size,BinaryReaderDelegate *delegate,
                       ReadBinaryOptions *options)

{
  bool bVar1;
  Result RVar2;
  int iVar3;
  BinarySectionOrder BVar4;
  BinarySectionOrder BVar5;
  Enum EVar6;
  ulong uVar7;
  char *pcVar8;
  char *format;
  size_t sVar9;
  BinarySection sec;
  ulong uVar10;
  uint32_t magic;
  uint32_t value;
  BinaryReader reader;
  bool seen_section_code [14];
  byte local_155;
  uint local_154;
  size_t local_150;
  uint local_144;
  uint local_140;
  uint local_13c;
  BinaryReader local_138;
  char acStack_40 [16];
  
  local_138.state_.offset = 0;
  local_138.read_end_ = size;
  local_138.state_.data = (uint8_t *)data;
  local_138.state_.size = size;
  BinaryReaderLogging::BinaryReaderLogging
            (&local_138.logging_delegate_,options->log_stream,delegate);
  local_138.delegate_ = &local_138.logging_delegate_.super_BinaryReaderDelegate;
  if (options->log_stream == (Stream *)0x0) {
    local_138.delegate_ = delegate;
  }
  local_138.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.last_known_section_ = Invalid;
  local_138.did_read_names_section_ = false;
  local_138.reading_custom_section_ = false;
  local_138.num_func_imports_ = 0;
  local_138.num_table_imports_ = 0;
  local_138.num_memory_imports_ = 0;
  local_138.num_global_imports_ = 0;
  local_138.num_tag_imports_ = 0;
  local_138.num_function_signatures_ = 0;
  local_138.num_function_bodies_ = 0;
  local_138.data_count_ = 0xffffffff;
  local_138.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.options_ = options;
  (*delegate->_vptr_BinaryReaderDelegate[3])(delegate,&local_138.state_);
  bVar1 = options->stop_on_first_error;
  local_140 = 0;
  RVar2 = anon_unknown_25::BinaryReader::ReadT<unsigned_int>
                    (&local_138,&local_140,"uint32_t","magic");
  EVar6 = Error;
  sVar9 = local_138.read_end_;
  if (RVar2.enum_ == Error) goto LAB_001228b9;
  if (local_140 == 0x6d736100) {
    local_144 = 0;
    RVar2 = anon_unknown_25::BinaryReader::ReadT<unsigned_int>
                      (&local_138,&local_144,"uint32_t","version");
    EVar6 = Error;
    sVar9 = local_138.read_end_;
    if (RVar2.enum_ == Error) goto LAB_001228b9;
    if (local_144 != 1) {
      anon_unknown_25::BinaryReader::PrintError
                (&local_138,"bad wasm file version: %#x (expected %#x)",(ulong)local_144,1);
      sVar9 = local_138.read_end_;
      goto LAB_001228b9;
    }
    iVar3 = (*(local_138.delegate_)->_vptr_BinaryReaderDelegate[4])(local_138.delegate_,1);
    if (iVar3 == 0) {
      acStack_40[8] = '\0';
      acStack_40[9] = '\0';
      acStack_40[10] = '\0';
      acStack_40[0xb] = '\0';
      acStack_40[0xc] = '\0';
      acStack_40[0xd] = '\0';
      acStack_40[0] = '\0';
      acStack_40[1] = '\0';
      acStack_40[2] = '\0';
      acStack_40[3] = '\0';
      acStack_40[4] = '\0';
      acStack_40[5] = '\0';
      acStack_40[6] = '\0';
      acStack_40[7] = '\0';
      if (local_138.state_.offset < local_138.state_.size) {
        RVar2 = anon_unknown_25::BinaryReader::ReadU8(&local_138,&local_155,"section code");
        sVar9 = local_138.read_end_;
        if (RVar2.enum_ != Error) {
          local_154 = 0;
          while (RVar2 = anon_unknown_25::BinaryReader::ReadU32Leb128
                                   (&local_138,&local_13c,"section size"),
                sVar9 = local_138.read_end_, RVar2.enum_ != Error) {
            uVar7 = local_138.state_.offset + local_13c;
            uVar10 = (ulong)local_155;
            if (local_155 < 0xe) {
              if (uVar10 == 0) {
LAB_00122a6b:
                if (local_138.state_.size < uVar7) {
                  pcVar8 = "invalid section size: extends past end";
                  local_138.read_end_ = uVar7;
                }
                else {
                  local_150 = local_138.read_end_;
                  sec = (BinarySection)local_155;
                  local_138.read_end_ = uVar7;
                  if ((uVar10 != 0) && (local_138.last_known_section_ != Invalid)) {
                    BVar4 = GetSectionOrder(sec);
                    BVar5 = GetSectionOrder(local_138.last_known_section_);
                    sVar9 = local_150;
                    if ((int)BVar4 <= (int)BVar5) {
                      pcVar8 = GetSectionName(sec);
                      format = "section %s out of order";
                      goto LAB_00122d52;
                    }
                  }
                  sVar9 = local_150;
                  if ((uVar10 != 0) && (local_138.did_read_names_section_ != false)) {
                    pcVar8 = GetSectionName(sec);
                    format = "%s section can not occur after Name section";
                    goto LAB_00122d52;
                  }
                  iVar3 = (*(local_138.delegate_)->_vptr_BinaryReaderDelegate[6])
                                    (local_138.delegate_,(ulong)local_154,(ulong)(uint)sec,
                                     (ulong)local_13c);
                  if (iVar3 == 0) {
                    EVar6 = (*(code *)(&DAT_00153a28 +
                                      *(int *)(&DAT_00153a28 + (ulong)(uint)local_155 * 4)))();
                    return (Result)EVar6;
                  }
                  pcVar8 = "BeginSection callback failed";
                }
                anon_unknown_25::BinaryReader::PrintError(&local_138,pcVar8);
              }
              else {
                if (acStack_40[uVar10] != '\x01') {
                  acStack_40[uVar10] = '\x01';
                  goto LAB_00122a6b;
                }
                local_138.read_end_ = uVar7;
                pcVar8 = GetSectionName((uint)local_155);
                format = "multiple %s sections";
LAB_00122d52:
                anon_unknown_25::BinaryReader::PrintError(&local_138,format,pcVar8);
              }
              break;
            }
            local_138.read_end_ = uVar7;
            anon_unknown_25::BinaryReader::PrintError
                      (&local_138,"invalid section code: %u",(ulong)(uint)local_155);
            if (bVar1 != false) break;
            local_138.state_.offset = local_138.read_end_;
            if (local_138.state_.size <= local_138.read_end_) {
              EVar6 = Error;
              break;
            }
            local_154 = local_154 + 1;
            local_138.read_end_ = sVar9;
            RVar2 = anon_unknown_25::BinaryReader::ReadU8(&local_138,&local_155,"section code");
            sVar9 = local_138.read_end_;
            if (RVar2.enum_ == Error) break;
          }
        }
        goto LAB_001228b9;
      }
      if (local_138.num_function_signatures_ == local_138.num_function_bodies_) {
        iVar3 = (*(local_138.delegate_)->_vptr_BinaryReaderDelegate[5])();
        if (iVar3 == 0) {
          EVar6 = Ok;
          sVar9 = local_138.read_end_;
          goto LAB_001228b9;
        }
        pcVar8 = "EndModule callback failed";
      }
      else {
        pcVar8 = "function signature count != function body count";
      }
    }
    else {
      pcVar8 = "BeginModule callback failed";
    }
  }
  else {
    pcVar8 = "bad magic value";
  }
  EVar6 = Error;
  anon_unknown_25::BinaryReader::PrintError(&local_138,pcVar8);
  sVar9 = local_138.read_end_;
LAB_001228b9:
  local_138.read_end_ = sVar9;
  if (local_138.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.memories.
                    super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.memories.
                          super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.memories.
                          super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.target_depths_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.target_depths_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.target_depths_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.fields_.
                    super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.fields_.
                          super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.fields_.
                          super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.result_types_.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.result_types_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.result_types_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.param_types_.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.param_types_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.param_types_.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (Result)EVar6;
}

Assistant:

Result ReadBinary(const void* data,
                  size_t size,
                  BinaryReaderDelegate* delegate,
                  const ReadBinaryOptions& options) {
  BinaryReader reader(data, size, delegate, options);
  return reader.ReadModule(
      BinaryReader::ReadModuleOptions{options.stop_on_first_error});
}